

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.c++
# Opt level: O3

Pipeline * __thiscall
capnp::AnyPointer::Pipeline::getPointerField
          (Pipeline *__return_storage_ptr__,Pipeline *this,uint16_t pointerIndex)

{
  size_t sVar1;
  PipelineOp *pPVar2;
  unsigned_long i;
  size_t sVar3;
  size_t elementCount;
  Disposer *local_48;
  PipelineHook *pPStack_40;
  
  elementCount = (this->ops).size_ + 1;
  sVar3 = 0;
  pPVar2 = (PipelineOp *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  sVar1 = (this->ops).size_;
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      pPVar2[sVar3] = (this->ops).ptr[sVar3];
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    sVar3 = (this->ops).size_;
  }
  pPVar2[sVar3].type = GET_POINTER_FIELD;
  pPVar2[sVar3].field_1.pointerIndex = pointerIndex;
  (**((this->hook).ptr)->_vptr_PipelineHook)(&local_48);
  (__return_storage_ptr__->hook).disposer = local_48;
  (__return_storage_ptr__->hook).ptr = pPStack_40;
  (__return_storage_ptr__->ops).ptr = pPVar2;
  (__return_storage_ptr__->ops).size_ = elementCount;
  (__return_storage_ptr__->ops).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Pipeline AnyPointer::Pipeline::getPointerField(uint16_t pointerIndex) {
  auto newOps = kj::heapArray<PipelineOp>(ops.size() + 1);
  for (auto i: kj::indices(ops)) {
    newOps[i] = ops[i];
  }
  auto& newOp = newOps[ops.size()];
  newOp.type = PipelineOp::GET_POINTER_FIELD;
  newOp.pointerIndex = pointerIndex;

  return Pipeline(hook->addRef(), kj::mv(newOps));
}